

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemUtils.cpp
# Opt level: O0

void ApprovalTests::SystemUtils::runSystemCommandOrThrow(string *command,bool allowNonZeroExitCodes)

{
  char *__command;
  runtime_error *this;
  byte in_SIL;
  int exitCode;
  char *in_stack_ffffffffffffff90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffbc;
  string local_30 [32];
  int local_10;
  byte local_9;
  
  local_9 = in_SIL & 1;
  __command = (char *)::std::__cxx11::string::c_str();
  local_10 = system(__command);
  if (((local_9 & 1) == 0) && (local_10 != 0)) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::operator+(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    ::std::__cxx11::to_string(in_stack_ffffffffffffffbc);
    ::std::operator+(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    ::std::runtime_error::runtime_error(this,local_30);
    __cxa_throw(this,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

void SystemUtils::runSystemCommandOrThrow(const std::string& command,
                                              bool allowNonZeroExitCodes)
    {
        int exitCode = system(command.c_str());

        if (!allowNonZeroExitCodes && exitCode != 0)
        {
            throw std::runtime_error(command + ": failed with exit code " +
                                     std::to_string(exitCode));
        }
    }